

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

void __thiscall QMakeEvaluator::updateFeaturePaths(QMakeEvaluator *this)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  bool bVar1;
  uint uVar2;
  long lVar3;
  qsizetype qVar4;
  const_reference pQVar5;
  ulong uVar6;
  const_iterator o;
  QMakeFeatureRoots *o_00;
  long in_RDI;
  long in_FS_OFFSET;
  QString *root;
  add_const_t<QList<QString>_> *__range1_3;
  int i;
  ProString *sfx;
  ProStringList *__range2;
  QString *fb;
  add_const_t<QList<QString>_> *__range1_2;
  QString *item_1;
  add_const_t<QList<QString>_> *__range1_1;
  QString *item;
  QStringList *__range1;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  QStringList ret;
  const_iterator __end2;
  const_iterator __begin2;
  ProStringList sfxs;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  QString specpath;
  QDir specdir;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList items;
  QStringList feature_bases;
  QStringList feature_roots;
  QString features_concat;
  QString mkspecs_concat;
  QStringBuilder<ProString,_QString_&> *in_stack_fffffffffffff9b8;
  QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_ProString_&>
  *in_stack_fffffffffffff9c0;
  QMakeFeatureRoots *this_00;
  QMakeGlobals *in_stack_fffffffffffff9c8;
  QChar QVar7;
  QLatin1String *in_stack_fffffffffffff9d0;
  QMakeGlobals *in_stack_fffffffffffff9d8;
  ProKey *variableName;
  QMakeEvaluator *this_01;
  undefined6 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f6;
  undefined1 in_stack_fffffffffffff9f7;
  byte bVar8;
  QMakeGlobals *in_stack_fffffffffffff9f8;
  char *pcVar9;
  int local_5cc;
  int local_5a4;
  const_iterator local_568;
  undefined1 local_560 [29];
  QLatin1Char local_543;
  ushort local_542;
  QStringBuilder<const_QString_&,_QString_&> local_540;
  QLatin1Char local_511;
  QStringBuilder<const_QString_&,_QString_&> local_510;
  ProString *local_4d0;
  const_iterator local_4c8;
  const_iterator local_4c0 [7];
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  QString *local_470;
  const_iterator local_468;
  const_iterator local_460 [45];
  QStringBuilder<const_QString_&,_QString_&> local_2f8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  QStringBuilder<QString_&,_QString_&> local_2b0;
  QStringBuilder<const_QString_&,_QString_&> local_288;
  QString *local_260;
  const_iterator local_258;
  const_iterator local_250;
  QStringBuilder<const_QString_&,_QString_&> local_248;
  QString *local_220;
  const_iterator local_218;
  const_iterator local_210 [6];
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  QStringBuilder<QString_&,_QString_&> local_1c8;
  QStringBuilder<QString_&,_QString_&> local_1a0;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  QList<QString> local_90;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0xaaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  QLatin1String::QLatin1String(in_stack_fffffffffffff9d0,&in_stack_fffffffffffff9c8->do_cache);
  latin1.m_size._6_1_ = in_stack_fffffffffffff9f6;
  latin1.m_size._0_6_ = in_stack_fffffffffffff9f0;
  latin1.m_size._7_1_ = in_stack_fffffffffffff9f7;
  latin1.m_data = &in_stack_fffffffffffff9f8->do_cache;
  QString::QString((QString *)in_stack_fffffffffffff9d0,latin1);
  local_68 = 0xaaaaaaaaaaaaaaaa;
  local_60 = 0xaaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaaaaaaaaaa;
  QLatin1String::QLatin1String(in_stack_fffffffffffff9d0,&in_stack_fffffffffffff9c8->do_cache);
  latin1_00.m_size._6_1_ = in_stack_fffffffffffff9f6;
  latin1_00.m_size._0_6_ = in_stack_fffffffffffff9f0;
  latin1_00.m_size._7_1_ = in_stack_fffffffffffff9f7;
  latin1_00.m_data = &in_stack_fffffffffffff9f8->do_cache;
  QString::QString((QString *)in_stack_fffffffffffff9d0,latin1_00);
  local_90.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_90.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  local_90.d.size = -0x5555555555555556;
  QList<QString>::QList((QList<QString> *)0x2fc827);
  QLatin1String::QLatin1String(in_stack_fffffffffffff9d0,&in_stack_fffffffffffff9c8->do_cache);
  latin1_01.m_size._6_1_ = in_stack_fffffffffffff9f6;
  latin1_01.m_size._0_6_ = in_stack_fffffffffffff9f0;
  latin1_01.m_size._7_1_ = in_stack_fffffffffffff9f7;
  latin1_01.m_data = &in_stack_fffffffffffff9f8->do_cache;
  QString::QString((QString *)in_stack_fffffffffffff9d0,latin1_01);
  QMakeGlobals::getPathListEnv(in_stack_fffffffffffff9d8,(QString *)in_stack_fffffffffffff9d0);
  QList<QString>::operator+=
            ((QList<QString> *)in_stack_fffffffffffff9c0,(QList<QString> *)in_stack_fffffffffffff9b8
            );
  QList<QString>::~QList((QList<QString> *)0x2fc8a5);
  QString::~QString((QString *)0x2fc8b2);
  QList<QString>::operator+=
            ((QList<QString> *)in_stack_fffffffffffff9c0,(QList<QString> *)in_stack_fffffffffffff9b8
            );
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff9c0,(char *)in_stack_fffffffffffff9b8);
  QMakeGlobals::propertyValue(in_stack_fffffffffffff9c8,(ProKey *)in_stack_fffffffffffff9c0);
  ProString::toQString(&in_stack_fffffffffffff9b8->a);
  QMakeGlobals::splitPathList
            (in_stack_fffffffffffff9f8,
             (QString *)
             CONCAT17(in_stack_fffffffffffff9f7,
                      CONCAT16(in_stack_fffffffffffff9f6,in_stack_fffffffffffff9f0)));
  QList<QString>::operator+=
            ((QList<QString> *)in_stack_fffffffffffff9c0,(QList<QString> *)in_stack_fffffffffffff9b8
            );
  QList<QString>::~QList((QList<QString> *)0x2fc967);
  QString::~QString((QString *)0x2fc974);
  ProString::~ProString((ProString *)0x2fc981);
  ProKey::~ProKey((ProKey *)0x2fc98e);
  local_178 = 0xaaaaaaaaaaaaaaaa;
  local_170 = 0xaaaaaaaaaaaaaaaa;
  local_168 = 0xaaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x2fc9c8);
  bVar1 = QString::isEmpty((QString *)0x2fc9d9);
  if (!bVar1) {
    local_1a0 = ::operator+((QString *)in_stack_fffffffffffff9c0,
                            (QString *)in_stack_fffffffffffff9b8);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString_&,_QString_&> *)in_stack_fffffffffffff9b8);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff9c0,(rvalue_ref)in_stack_fffffffffffff9b8);
    QString::~QString((QString *)0x2fca3d);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff9c0,(parameter_type)in_stack_fffffffffffff9b8
              );
  }
  bVar1 = QString::isEmpty((QString *)0x2fca67);
  if (!bVar1) {
    local_1c8 = ::operator+((QString *)in_stack_fffffffffffff9c0,
                            (QString *)in_stack_fffffffffffff9b8);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString_&,_QString_&> *)in_stack_fffffffffffff9b8);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff9c0,(rvalue_ref)in_stack_fffffffffffff9b8);
    QString::~QString((QString *)0x2fcacb);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff9c0,(parameter_type)in_stack_fffffffffffff9b8
              );
  }
  local_1e0 = 0xaaaaaaaaaaaaaaaa;
  local_1d8 = 0xaaaaaaaaaaaaaaaa;
  local_1d0 = 0xaaaaaaaaaaaaaaaa;
  pcVar9 = *(char **)(in_RDI + 0x290);
  QLatin1String::QLatin1String(in_stack_fffffffffffff9d0,&in_stack_fffffffffffff9c8->do_cache);
  latin1_02.m_size._6_1_ = in_stack_fffffffffffff9f6;
  latin1_02.m_size._0_6_ = in_stack_fffffffffffff9f0;
  latin1_02.m_size._7_1_ = in_stack_fffffffffffff9f7;
  latin1_02.m_data = pcVar9;
  QString::QString((QString *)in_stack_fffffffffffff9d0,latin1_02);
  QMakeGlobals::getPathListEnv(in_stack_fffffffffffff9d8,(QString *)in_stack_fffffffffffff9d0);
  QString::~QString((QString *)0x2fcb7a);
  local_210[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_210[0] = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffff9c0);
  local_218.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_218 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffff9c0);
  while( true ) {
    local_220 = local_218.i;
    bVar1 = QList<QString>::const_iterator::operator!=(local_210,local_218);
    if (!bVar1) break;
    QList<QString>::const_iterator::operator*(local_210);
    local_248 = ::operator+((QString *)in_stack_fffffffffffff9c0,
                            (QString *)in_stack_fffffffffffff9b8);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<const_QString_&,_QString_&> *)in_stack_fffffffffffff9b8);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff9c0,(rvalue_ref)in_stack_fffffffffffff9b8);
    QString::~QString((QString *)0x2fcc95);
    QList<QString>::const_iterator::operator++(local_210);
  }
  local_250.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_250 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffff9c0);
  local_258.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_258 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffff9c0);
  while( true ) {
    local_260 = local_258.i;
    bVar1 = QList<QString>::const_iterator::operator!=(&local_250,local_258);
    if (!bVar1) break;
    QList<QString>::const_iterator::operator*(&local_250);
    local_288 = ::operator+((QString *)in_stack_fffffffffffff9c0,
                            (QString *)in_stack_fffffffffffff9b8);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<const_QString_&,_QString_&> *)in_stack_fffffffffffff9b8);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff9c0,(rvalue_ref)in_stack_fffffffffffff9b8);
    QString::~QString((QString *)0x2fcdc5);
    QList<QString>::const_iterator::operator++(&local_250);
  }
  bVar1 = QString::isEmpty((QString *)0x2fcde8);
  if (!bVar1) {
    local_2b0 = ::operator+((QString *)in_stack_fffffffffffff9c0,
                            (QString *)in_stack_fffffffffffff9b8);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString_&,_QString_&> *)in_stack_fffffffffffff9b8);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff9c0,(rvalue_ref)in_stack_fffffffffffff9b8);
    QString::~QString((QString *)0x2fce50);
    local_2b8 = 0xaaaaaaaaaaaaaaaa;
    QDir::QDir((QDir *)&local_2b8,(QString *)(in_RDI + 0x98));
    do {
      uVar2 = QDir::isRoot();
      bVar8 = 0;
      if ((uVar2 & 1) == 0) {
        bVar8 = QDir::cdUp();
      }
      if ((bVar8 & 1) == 0) break;
      local_2d0 = 0xaaaaaaaaaaaaaaaa;
      local_2c8 = 0xaaaaaaaaaaaaaaaa;
      local_2c0 = 0xaaaaaaaaaaaaaaaa;
      QDir::path();
      uVar6 = QString::endsWith((QString *)&local_2d0,(CaseSensitivity)&local_40);
      if ((uVar6 & 1) == 0) {
        local_5a4 = 0;
      }
      else {
        local_2f8 = ::operator+((QString *)in_stack_fffffffffffff9c0,
                                (QString *)in_stack_fffffffffffff9b8);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<const_QString_&,_QString_&> *)in_stack_fffffffffffff9b8);
        bVar8 = QMakeInternal::IoUtils::exists((QString *)0x2fcf5c);
        QString::~QString((QString *)0x2fcf6d);
        if ((bVar8 & 1) != 0) {
          QList<QString>::operator<<
                    ((QList<QString> *)in_stack_fffffffffffff9c0,
                     (parameter_type)in_stack_fffffffffffff9b8);
        }
        local_5a4 = 7;
      }
      QString::~QString((QString *)0x2fcfb1);
    } while (local_5a4 == 0);
    QDir::~QDir((QDir *)&local_2b8);
  }
  variableName = *(ProKey **)(in_RDI + 0x290);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff9c0,(char *)in_stack_fffffffffffff9b8);
  QMakeGlobals::propertyValue(in_stack_fffffffffffff9c8,(ProKey *)in_stack_fffffffffffff9c0);
  ::operator+((ProString *)in_stack_fffffffffffff9c8,(QString *)in_stack_fffffffffffff9c0);
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffff9b8);
  QList<QString>::operator<<
            ((QList<QString> *)in_stack_fffffffffffff9c0,(rvalue_ref)in_stack_fffffffffffff9b8);
  QString::~QString((QString *)0x2fd065);
  QStringBuilder<ProString,_QString_&>::~QStringBuilder
            ((QStringBuilder<ProString,_QString_&> *)0x2fd072);
  ProString::~ProString((ProString *)0x2fd07f);
  ProKey::~ProKey((ProKey *)0x2fd08c);
  this_01 = *(QMakeEvaluator **)(in_RDI + 0x290);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff9c0,(char *)in_stack_fffffffffffff9b8);
  QMakeGlobals::propertyValue(in_stack_fffffffffffff9c8,(ProKey *)in_stack_fffffffffffff9c0);
  ::operator+((ProString *)in_stack_fffffffffffff9c8,(QString *)in_stack_fffffffffffff9c0);
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffff9b8);
  QList<QString>::operator<<
            ((QList<QString> *)in_stack_fffffffffffff9c0,(rvalue_ref)in_stack_fffffffffffff9b8);
  QString::~QString((QString *)0x2fd11f);
  QStringBuilder<ProString,_QString_&>::~QStringBuilder
            ((QStringBuilder<ProString,_QString_&> *)0x2fd12c);
  ProString::~ProString((ProString *)0x2fd139);
  ProKey::~ProKey((ProKey *)0x2fd146);
  local_460[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_460[0] = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffff9c0);
  local_468.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_468 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffff9c0);
  while( true ) {
    local_470 = local_468.i;
    bVar1 = QList<QString>::const_iterator::operator!=(local_460,local_468);
    if (!bVar1) break;
    QList<QString>::const_iterator::operator*(local_460);
    local_488 = 0xaaaaaaaaaaaaaaaa;
    local_480 = 0xaaaaaaaaaaaaaaaa;
    local_478 = 0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff9c0,(char *)in_stack_fffffffffffff9b8);
    values(this_01,variableName);
    ProKey::~ProKey((ProKey *)0x2fd26d);
    local_4c0[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_4c0[0] = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffff9c0);
    local_4c8.i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_4c8 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffff9c0);
    while( true ) {
      local_4d0 = local_4c8.i;
      bVar1 = QList<ProString>::const_iterator::operator!=(local_4c0,local_4c8);
      if (!bVar1) break;
      QList<ProString>::const_iterator::operator*(local_4c0);
      local_510 = ::operator+((QString *)in_stack_fffffffffffff9c0,
                              (QString *)in_stack_fffffffffffff9b8);
      ::operator+(&in_stack_fffffffffffff9c0->a,&in_stack_fffffffffffff9b8->a);
      QLatin1Char::QLatin1Char(&local_511,'/');
      ::operator+(in_stack_fffffffffffff9c0,(QLatin1Char *)in_stack_fffffffffffff9b8);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_ProString_&>,_QLatin1Char>
                  *)in_stack_fffffffffffff9b8);
      QList<QString>::operator<<
                ((QList<QString> *)in_stack_fffffffffffff9c0,(rvalue_ref)in_stack_fffffffffffff9b8);
      QString::~QString((QString *)0x2fd3d4);
      QList<ProString>::const_iterator::operator++(local_4c0);
    }
    local_540 = ::operator+((QString *)in_stack_fffffffffffff9c0,
                            (QString *)in_stack_fffffffffffff9b8);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<const_QString_&,_QString_&> *)in_stack_fffffffffffff9b8);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_fffffffffffff9c0,(rvalue_ref)in_stack_fffffffffffff9b8);
    QString::~QString((QString *)0x2fd442);
    ProStringList::~ProStringList((ProStringList *)0x2fd44f);
    QList<QString>::const_iterator::operator++(local_460);
  }
  local_5cc = 0;
  while( true ) {
    lVar3 = (long)local_5cc;
    qVar4 = QList<QString>::size(&local_90);
    if (qVar4 <= lVar3) break;
    pQVar5 = QList<QString>::at((QList<QString> *)in_stack_fffffffffffff9c0,
                                (qsizetype)in_stack_fffffffffffff9b8);
    QVar7.ucs = (char16_t)pQVar5;
    QLatin1Char::QLatin1Char(&local_543,'/');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)in_stack_fffffffffffff9c0,
               (QLatin1Char)(char)((ulong)in_stack_fffffffffffff9c8 >> 0x38));
    uVar6 = QString::endsWith(QVar7,(uint)local_542);
    if ((uVar6 & 1) == 0) {
      in_stack_fffffffffffff9c8 =
           (QMakeGlobals *)
           QList<QString>::operator[]
                     ((QList<QString> *)in_stack_fffffffffffff9c0,
                      (qsizetype)in_stack_fffffffffffff9b8);
      QLatin1Char::QLatin1Char((QLatin1Char *)(local_560 + 0x19),'/');
      QChar::QChar<QLatin1Char,_true>
                ((QChar *)in_stack_fffffffffffff9c0,
                 (QLatin1Char)(char)((ulong)in_stack_fffffffffffff9c8 >> 0x38));
      QString::append((QChar)(char16_t)in_stack_fffffffffffff9c8);
    }
    local_5cc = local_5cc + 1;
  }
  QListSpecialMethods<QString>::removeDuplicates((QListSpecialMethods<QString> *)0x2fd559);
  local_560._0_8_ = 0xaaaaaaaaaaaaaaaa;
  local_560._8_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
  local_560._16_8_ = (QString *)0xaaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x2fd593);
  local_568.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_568 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffff9c0);
  o = QList<QString>::end((QList<QString> *)in_stack_fffffffffffff9c0);
  while (bVar1 = QList<QString>::const_iterator::operator!=(&local_568,o), bVar1) {
    QList<QString>::const_iterator::operator*(&local_568);
    bVar1 = QMakeInternal::IoUtils::exists((QString *)0x2fd647);
    if (bVar1) {
      QList<QString>::operator<<
                ((QList<QString> *)in_stack_fffffffffffff9c0,
                 (parameter_type)in_stack_fffffffffffff9b8);
    }
    QList<QString>::const_iterator::operator++(&local_568);
  }
  o_00 = (QMakeFeatureRoots *)operator_new(0x28);
  this_00 = (QMakeFeatureRoots *)local_560;
  QMakeFeatureRoots::QMakeFeatureRoots(this_00,(QStringList *)o_00);
  QExplicitlySharedDataPointer<QMakeFeatureRoots>::operator=
            ((QExplicitlySharedDataPointer<QMakeFeatureRoots> *)this_00,o_00);
  QList<QString>::~QList((QList<QString> *)0x2fd6b2);
  QList<QString>::~QList((QList<QString> *)0x2fd6bf);
  QList<QString>::~QList((QList<QString> *)0x2fd6cc);
  QList<QString>::~QList((QList<QString> *)0x2fd6d9);
  QString::~QString((QString *)0x2fd6e6);
  QString::~QString((QString *)0x2fd6f3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeEvaluator::updateFeaturePaths()
{
    QString mkspecs_concat = QLatin1String("/mkspecs");
    QString features_concat = QLatin1String("/features/");

    QStringList feature_roots;

    feature_roots += m_option->getPathListEnv(QLatin1String("QMAKEFEATURES"));
    feature_roots += m_qmakefeatures;
    feature_roots += m_option->splitPathList(
                m_option->propertyValue(ProKey("QMAKEFEATURES")).toQString());

    QStringList feature_bases;
    if (!m_buildRoot.isEmpty()) {
        feature_bases << m_buildRoot + mkspecs_concat;
        feature_bases << m_buildRoot;
    }
    if (!m_sourceRoot.isEmpty()) {
        feature_bases << m_sourceRoot + mkspecs_concat;
        feature_bases << m_sourceRoot;
    }

    const auto items = m_option->getPathListEnv(QLatin1String("QMAKEPATH"));
    for (const QString &item : items)
        feature_bases << (item + mkspecs_concat);

    for (const QString &item : std::as_const(m_qmakepath))
        feature_bases << (item + mkspecs_concat);

    if (!m_qmakespec.isEmpty()) {
        // The spec is already platform-dependent, so no subdirs here.
        feature_roots << (m_qmakespec + features_concat);

        // Also check directly under the root directory of the mkspecs collection
        QDir specdir(m_qmakespec);
        while (!specdir.isRoot() && specdir.cdUp()) {
            const QString specpath = specdir.path();
            if (specpath.endsWith(mkspecs_concat)) {
                if (IoUtils::exists(specpath + features_concat))
                    feature_bases << specpath;
                break;
            }
        }
    }

    feature_bases << (m_option->propertyValue(ProKey("QT_HOST_DATA/get")) + mkspecs_concat);
    feature_bases << (m_option->propertyValue(ProKey("QT_HOST_DATA/src")) + mkspecs_concat);

    for (const QString &fb : std::as_const(feature_bases)) {
        const auto sfxs = values(ProKey("QMAKE_PLATFORM"));
        for (const ProString &sfx : sfxs)
            feature_roots << (fb + features_concat + sfx + QLatin1Char('/'));
        feature_roots << (fb + features_concat);
    }

    for (int i = 0; i < feature_roots.size(); ++i)
        if (!feature_roots.at(i).endsWith(QLatin1Char('/')))
            feature_roots[i].append(QLatin1Char('/'));

    feature_roots.removeDuplicates();

    QStringList ret;
    for (const QString &root : std::as_const(feature_roots))
        if (IoUtils::exists(root))
            ret << root;
    m_featureRoots = new QMakeFeatureRoots(ret);
}